

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

reentrant_put_transaction<void> *
density_tests::detail::
PutString<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  reentrant_put_transaction<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"hello world!","");
  density::
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_emplace<std::__cxx11::string,std::__cxx11::string&>
            (&local_40,
             (sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)i_queue,&local_60);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_40.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_40.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_40.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_40.m_queue;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                std::string str("hello world!");
                auto        transaction = i_queue.start_reentrant_push(str);
                exception_checkpoint();
                return std::move(transaction);
            }